

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmFMovem<(moira::Instr)193,(moira::Mode)4,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  u32 ext;
  uint uVar5;
  StrWriter *pSVar6;
  uint uVar7;
  Dn dn;
  Dn dn_00;
  FRegList FVar8;
  Moira *this_00;
  Fctrl fctrl;
  byte bVar9;
  ushort uVar10;
  Ea<(moira::Mode)4,_4> result;
  
  uVar1 = *addr;
  this_00 = this;
  ext = dasmIncRead<2>(this,addr);
  if (((str->style->syntax & ~MOIRA_MIT) == GNU) &&
     (bVar4 = isValidExtFPU(this_00,FMOVEM,PD,op,ext), !bVar4)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)193,(moira::Mode)4,0>(this,str,addr,op);
    return;
  }
  uVar5 = ext >> 0xd & 7;
  if (3 < uVar5 - 4) {
    return;
  }
  uVar10 = op & 7;
  uVar7 = ext >> 0xb & 3;
  bVar9 = (byte)ext >> 4 & 7;
  fctrl.raw = ext >> 10 & 7;
  result.reg = uVar10;
  switch(uVar5) {
  case 4:
    if (((ext & 0x1c00) == 0) && ((str->style->syntax & ~MOIRA_MIT) == GNU)) {
      StrWriter::operator<<(str,"fmovel");
      StrWriter::operator<<(str,(Tab)(str->tab).raw);
      result.pc = *addr;
      StrWriter::operator<<(str,&result);
      StrWriter::operator<<(str);
      return;
    }
    if (((uint)fctrl.raw < 5) && (fctrl.raw != 3)) {
      pSVar6 = StrWriter::operator<<(str);
    }
    else {
      pSVar6 = StrWriter::operator<<(str);
    }
    StrWriter::operator<<(pSVar6,(Ffmt)0x0);
    StrWriter::operator<<(pSVar6,(Tab)(str->tab).raw);
    result.pc = *addr;
    StrWriter::operator<<(str,&result);
    StrWriter::operator<<(str);
    StrWriter::operator<<(str,fctrl);
    return;
  case 5:
    if (((ext & 0x1c00) == 0) && ((str->style->syntax & ~MOIRA_MIT) == GNU)) {
      pSVar6 = StrWriter::operator<<(str);
      StrWriter::operator<<(pSVar6,(Ffmt)0x0);
      StrWriter::operator<<(pSVar6,(Tab)(str->tab).raw);
      StrWriter::operator<<(pSVar6);
      result.pc = *addr;
      str = pSVar6;
      goto LAB_00237f81;
    }
    if (((uint)fctrl.raw < 5) && (fctrl.raw != 3)) {
      pSVar6 = StrWriter::operator<<(str);
    }
    else {
      pSVar6 = StrWriter::operator<<(str);
    }
    StrWriter::operator<<(pSVar6,(Ffmt)0x0);
    StrWriter::operator<<(pSVar6,(Tab)(str->tab).raw);
    StrWriter::operator<<(str,fctrl);
    break;
  case 6:
    switch(uVar7) {
    case 0:
      pSVar6 = StrWriter::operator<<(str);
      StrWriter::operator<<(pSVar6,(Ffmt)0x2);
      StrWriter::operator<<(pSVar6,(Tab)(str->tab).raw);
      result.pc = *addr;
      StrWriter::operator<<(str,&result);
      StrWriter::operator<<(str);
      FVar8.raw = (u16)(ext & 0xff);
      if ((ext & 0xff) == 0) {
LAB_00237f33:
        StrWriter::operator<<(str,(Imd)0x0);
        return;
      }
      break;
    default:
      pSVar6 = StrWriter::operator<<(str);
      StrWriter::operator<<(pSVar6,(Ffmt)0x2);
      StrWriter::operator<<(pSVar6,(Tab)(str->tab).raw);
      result.pc = *addr;
      StrWriter::operator<<(str,&result);
      StrWriter::operator<<(str);
      dn.raw._1_3_ = 0;
      dn.raw._0_1_ = bVar9;
      StrWriter::operator<<(str,dn);
      return;
    case 2:
      pSVar6 = StrWriter::operator<<(str);
      StrWriter::operator<<(pSVar6,(Ffmt)0x2);
      StrWriter::operator<<(pSVar6,(Tab)(str->tab).raw);
      result.pc = *addr;
      StrWriter::operator<<(str,&result);
      StrWriter::operator<<(str);
      if ((ext & 0xff) == 0) goto LAB_00237f33;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (ulong)(ext & 0xff) * 0x202020202 & 0x10884422010;
      FVar8.raw = (u16)SUB161(auVar2 % ZEXT816(0x3ff),0);
    }
    StrWriter::operator<<(str,FVar8);
    return;
  case 7:
    switch(uVar7) {
    case 0:
      pSVar6 = StrWriter::operator<<(str);
      StrWriter::operator<<(pSVar6,(Ffmt)0x2);
      StrWriter::operator<<(pSVar6,(Tab)(str->tab).raw);
      FVar8.raw = (u16)(ext & 0xff);
      if ((ext & 0xff) != 0) goto LAB_00237f2c;
LAB_00237f5c:
      StrWriter::operator<<(str,(Imd)0x0);
      break;
    default:
      pSVar6 = StrWriter::operator<<(str);
      StrWriter::operator<<(pSVar6,(Ffmt)0x2);
      StrWriter::operator<<(pSVar6,(Tab)(str->tab).raw);
      dn_00.raw._1_3_ = 0;
      dn_00.raw._0_1_ = bVar9;
      StrWriter::operator<<(str,dn_00);
      break;
    case 2:
      pSVar6 = StrWriter::operator<<(str);
      StrWriter::operator<<(pSVar6,(Ffmt)0x2);
      StrWriter::operator<<(pSVar6,(Tab)(str->tab).raw);
      if ((ext & 0xff) == 0) goto LAB_00237f5c;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (ulong)(ext & 0xff) * 0x202020202 & 0x10884422010;
      FVar8.raw = (u16)SUB161(auVar3 % ZEXT816(0x3ff),0);
LAB_00237f2c:
      StrWriter::operator<<(str,FVar8);
    }
  }
  StrWriter::operator<<(str);
  result.pc = *addr;
LAB_00237f81:
  StrWriter::operator<<(str,&result);
  return;
}

Assistant:

void
Moira::dasmFMovem(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead(addr);
    auto reg = _____________xxx (op);
    auto cod = xxx_____________ (ext);
    auto mod = ___xx___________ (ext);
    auto rrr = _________xxx____ (ext);
    auto lll = ___xxx__________ (ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtFPU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    switch (cod) {

        case 0b100: // Ea to Cntrl

            if ((ext & 0x1C00) == 0) {

                if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

                    str << "fmovel" << str.tab << Op<M, Long>(reg, addr) << Sep{};
                    return;
                }
            }
            if (lll == 0 || lll == 1 || lll == 2 || lll == 4) {
                str << Ins<Instr::FMOVE>{} << Ffmt{0} << str.tab;
            } else {
                str << Ins<Instr::FMOVEM>{} << Ffmt{0} << str.tab;
            }
            str << Op<M, Long>(reg, addr) << Sep{} << Fctrl{lll};
            break;

        case 0b101: // Cntrl to Ea

            if ((ext & 0x1C00) == 0) {

                if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

                    str << Ins<Instr::FMOVE>{} << Ffmt{0} << str.tab << Sep{} << Op<M, Long>(reg, addr);
                    return;
                }
            }
            if (lll == 0 || lll == 1 || lll == 2 || lll == 4) {
                str << Ins<Instr::FMOVE>{} << Ffmt{0} << str.tab;
            } else {
                str << Ins<Instr::FMOVEM>{} << Ffmt{0} << str.tab;
            }
            str << Fctrl{lll} << Sep{} << Op<M, Long>(reg, addr);
            break;

        case 0b110: // Memory to FPU

            switch (mod) {

                case 0b00: // Static list, predecrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    str << Op<M, Long>(reg, addr) << Sep{};
                    if (ext & 0xFF) {
                        str << FRegList(ext & 0xFF);
                    } else {
                        str << Imd{0};
                    }
                    break;

                case 0b01: // Dynamic list, predecrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    str << Op<M, Long>(reg, addr) << Sep{};
                    str << Dn{rrr};
                    break;

                case 0b10: // Static list, postincrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    str << Op<M, Long>(reg, addr) << Sep{};
                    if (ext & 0xFF) {
                        str << FRegList(REVERSE_8(ext & 0xFF));
                    } else {
                        str << Imd{0};
                    }
                    break;

                case 0b11: // Dynamic list, postincrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    str << Op<M, Long>(reg, addr) << Sep{};
                    str << Dn{rrr};
                    break;
            }
            break;

        case 0b111: // FPU to memory

            switch (mod) {

                case 0b00: // Static list, predecrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    if (ext & 0xFF) {
                        str << FRegList(ext & 0xFF);
                    } else {
                        str << Imd{0};
                    }
                    str << Sep{} << Op<M, Long>(reg, addr);
                    break;

                case 0b01: // Dynamic list, predecrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    str << Dn{rrr} << Sep{};
                    str << Op<M, Long>(reg, addr);
                    break;

                case 0b10: // Static list, postincrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    if (ext & 0xFF) {
                        str << FRegList(REVERSE_8(ext & 0xFF)) ;
                    } else {
                        str << Imd{0};
                    }
                    str << Sep{} << Op<M, Long>(reg, addr);
                    break;

                case 0b11: // Dynamic list, postincrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    str << Dn{rrr} << Sep{};
                    str << Op<M, Long>(reg, addr);
                    break;
            }
            break;
    }
}